

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::SampleStencilCase::iterate(SampleStencilCase *this)

{
  ostringstream *poVar1;
  int width;
  uint uVar2;
  TestLog *log;
  bool bVar3;
  int i_1;
  GLenum GVar4;
  long lVar5;
  ostream *poVar6;
  Surface *pSVar7;
  int i_2;
  void *__buf;
  void *__buf_00;
  char *description;
  void *__buf_01;
  ulong uVar8;
  int i;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  Surface clearedImg;
  Surface renderedImgSecond;
  Surface renderedImgFirst;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_240 [8];
  float local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  float local_21c;
  undefined1 local_218 [8];
  float local_210;
  undefined4 uStack_20c;
  float local_1fc;
  Surface local_1f8;
  Surface local_1e0;
  Vec2 local_1c8;
  Vec2 local_1c0;
  Vec2 local_1b8;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  log = ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar9 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&local_1e0,iVar9,iVar9);
  iVar9 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&local_1f8,iVar9,iVar9);
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  glwClearColor(0.0,0.0,0.0,1.0);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClearColor(0.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x473);
  glwClearStencil(0);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClearStencil(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x474);
  glwClear(0x4400);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x475);
  glwEnable(0xb90);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glEnable(GL_STENCIL_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x476);
  glwStencilFunc(0x207,1,1);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glStencilFunc(GL_ALWAYS, 1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x477);
  glwStencilOp(0x1e00,0x1e00,0x1e01);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x478);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing a pattern with glStencilFunc(GL_ALWAYS, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)"
             ,99);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  iVar9 = 0;
  do {
    fVar12 = ((float)iVar9 * 6.2831855) / 25.0;
    local_21c = (((float)iVar9 + 0.5) * 6.2831855) / 25.0;
    fVar10 = cosf(fVar12);
    fVar12 = sinf(fVar12);
    local_1fc = cosf(local_21c);
    fVar11 = sinf(local_21c);
    lVar5 = 0;
    do {
      *(undefined4 *)(local_1b0 + lVar5 * 4) = 0x3f800000;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    local_260._0_8_ = (pointer)0x0;
    local_260._8_4_ = 0.0;
    local_240._4_4_ = fVar12 * 0.95;
    local_240._0_4_ = fVar10 * 0.95;
    local_238 = 0.0;
    local_218._4_4_ = fVar11 * 0.95;
    local_218._0_4_ = local_1fc * 0.95;
    local_210 = 0.0;
    MultisampleCase::renderTriangle
              (&this->super_MultisampleCase,(Vec3 *)local_260,(Vec3 *)local_240,(Vec3 *)local_218,
               (Vec4 *)local_1b0,(Vec4 *)local_1b0,(Vec4 *)local_1b0);
    iVar9 = iVar9 + 1;
  } while (iVar9 != 0x19);
  MultisampleCase::readImage(&this->super_MultisampleCase,&local_1e0);
  local_260._0_8_ = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"RenderedImgFirst","");
  local_240 = (undefined1  [8])&local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"First image rendered","");
  pSVar7 = &local_1e0;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,(string *)local_260,(string *)local_240,pSVar7,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  iVar9 = (int)log;
  tcu::LogImage::write((LogImage *)local_1b0,iVar9,__buf,(size_t)pSVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if (local_240 != (undefined1  [8])&local_230) {
    operator_delete((void *)local_240,local_230._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,local_250._M_allocated_capacity + 1);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Clearing color buffer to black",0x1e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  glwClear(0x4000);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x48f);
  glwStencilFunc(0x202,1,1);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glStencilFunc(GL_EQUAL, 1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x490);
  glwStencilOp(0x1e00,0x1e00,0x1e00);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x491);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Checking that color buffer was actually cleared to black",0x38);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  width = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface((Surface *)local_218,width,width);
  MultisampleCase::readImage(&this->super_MultisampleCase,(Surface *)local_218);
  if (0 < (int)local_218._4_4_) {
    lVar5 = 0;
    fVar10 = 0.0;
    do {
      if (0 < (int)local_218._0_4_) {
        uVar8 = 0;
        do {
          uVar2 = *(uint *)(CONCAT44(uStack_20c,local_210) + (long)((int)lVar5 + (int)uVar8) * 4);
          if (uVar2 != 0xff000000) {
            poVar1 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Failure: first non-black pixel, color ",0x26);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"RGBA(",5);
            poVar6 = (ostream *)std::ostream::operator<<(poVar1,uVar2 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2 >> 8 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2 >> 0x10 & 0xff);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2 >> 0x18);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,", detected at coordinates (",0x1b);
            std::ostream::operator<<(poVar1,(int)uVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
            std::ostream::operator<<(poVar1,(int)fVar10);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            local_260._0_8_ = &local_250;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"ClearedImg","");
            local_240 = (undefined1  [8])&local_230;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_240,"Image after clearing, erroneously non-black","");
            pSVar7 = (Surface *)local_218;
            tcu::LogImage::LogImage
                      ((LogImage *)local_1b0,(string *)local_260,(string *)local_240,pSVar7,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write((LogImage *)local_1b0,iVar9,__buf_01,(size_t)pSVar7);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_p != local_180) {
              operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
            }
            if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
              operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
            }
            if (local_240 != (undefined1  [8])&local_230) {
              operator_delete((void *)local_240,local_230._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._0_8_ != &local_250) {
              operator_delete((void *)local_260._0_8_,local_250._M_allocated_capacity + 1);
            }
            tcu::TestContext::setTestResult
                      (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,
                       QP_TEST_RESULT_FAIL,"Failed");
            tcu::Surface::~Surface((Surface *)local_218);
            goto LAB_005f5197;
          }
          uVar8 = uVar8 + 1;
        } while (((ulong)local_218 & 0xffffffff) != uVar8);
      }
      fVar10 = (float)((int)fVar10 + 1);
      lVar5 = lVar5 + ((ulong)local_218 & 0xffffffff);
    } while (fVar10 != (float)local_218._4_4_);
  }
  tcu::Surface::~Surface((Surface *)local_218);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Drawing a viewport-sized quad with glStencilFunc(GL_EQUAL, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP) - should result in same image as the first"
             ,0x96);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  local_1b8.m_data[0] = 1.0;
  local_1b8.m_data[1] = -1.0;
  local_1c0.m_data[0] = -1.0;
  local_1c0.m_data[1] = 1.0;
  local_1c8.m_data = (float  [2])&DAT_3f8000003f800000;
  lVar5 = 0;
  do {
    *(undefined4 *)(local_1b0 + lVar5 * 4) = 0x3f800000;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  local_260._0_8_ = (pointer)0xbf800000bf800000;
  local_260._8_4_ = 0.0;
  local_240 = (undefined1  [8])0xbf8000003f800000;
  local_238 = 0.0;
  local_218 = (undefined1  [8])0x3f800000bf800000;
  local_210 = 0.0;
  MultisampleCase::renderTriangle
            (&this->super_MultisampleCase,(Vec3 *)local_260,(Vec3 *)local_240,(Vec3 *)local_218,
             (Vec4 *)local_1b0,(Vec4 *)local_1b0,(Vec4 *)local_1b0);
  MultisampleCase::renderTriangle
            (&this->super_MultisampleCase,&local_1c0,&local_1b8,&local_1c8,(Vec4 *)local_1b0,
             (Vec4 *)local_1b0,(Vec4 *)local_1b0);
  MultisampleCase::readImage(&this->super_MultisampleCase,&local_1f8);
  local_260._0_8_ = &local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"RenderedImgSecond","");
  local_240 = (undefined1  [8])&local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"Second image rendered","");
  pSVar7 = &local_1f8;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,(string *)local_260,(string *)local_240,pSVar7,
             QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)local_1b0,iVar9,__buf_00,(size_t)pSVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b0._0_8_ != (TestLog *)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if (local_240 != (undefined1  [8])&local_230) {
    operator_delete((void *)local_240,local_230._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._0_8_ != &local_250) {
    operator_delete((void *)local_260._0_8_,local_250._M_allocated_capacity + 1);
  }
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
  bVar3 = tcu::pixelThresholdCompare
                    (log,"ImageCompare","Image comparison",&local_1e0,&local_1f8,(RGBA *)local_1b0,
                     COMPARE_LOG_ON_ERROR);
  if (bVar3) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Success: The two images rendered are identical",0x2e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    description = "Passed";
  }
  else {
    description = "Failed";
  }
  tcu::TestContext::setTestResult
            (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,(uint)!bVar3,
             description);
LAB_005f5197:
  tcu::Surface::~Surface(&local_1f8);
  tcu::Surface::~Surface(&local_1e0);
  return STOP;
}

Assistant:

SampleStencilCase::IterateResult SampleStencilCase::iterate (void)
{
	TestLog&		log					= m_testCtx.getLog();
	tcu::Surface	renderedImgFirst	(m_viewportSize, m_viewportSize);
	tcu::Surface	renderedImgSecond	(m_viewportSize, m_viewportSize);

	randomizeViewport();

	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_CALL(glClearStencil(0));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT));
	GLU_CHECK_CALL(glEnable(GL_STENCIL_TEST));
	GLU_CHECK_CALL(glStencilFunc(GL_ALWAYS, 1, 1));
	GLU_CHECK_CALL(glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE));

	log << TestLog::Message << "Drawing a pattern with glStencilFunc(GL_ALWAYS, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_REPLACE)" << TestLog::EndMessage;

	{
		const int numTriangles = 25;
		for (int i = 0; i < numTriangles; i++)
		{
			float angle0 = 2.0f*DE_PI * (float)i			/ (float)numTriangles;
			float angle1 = 2.0f*DE_PI * ((float)i + 0.5f)	/ (float)numTriangles;

			renderTriangle(Vec2(0.0f, 0.0f),
						   Vec2(deFloatCos(angle0)*0.95f, deFloatSin(angle0)*0.95f),
						   Vec2(deFloatCos(angle1)*0.95f, deFloatSin(angle1)*0.95f),
						   Vec4(1.0f));
		}
	}

	readImage(renderedImgFirst);
	log << TestLog::Image("RenderedImgFirst", "First image rendered", renderedImgFirst, QP_IMAGE_COMPRESSION_MODE_PNG);

	log << TestLog::Message << "Clearing color buffer to black" << TestLog::EndMessage;

	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glStencilFunc(GL_EQUAL, 1, 1));
	GLU_CHECK_CALL(glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP));

	{
		log << TestLog::Message << "Checking that color buffer was actually cleared to black" << TestLog::EndMessage;

		tcu::Surface clearedImg(m_viewportSize, m_viewportSize);
		readImage(clearedImg);

		for (int y = 0; y < clearedImg.getHeight(); y++)
		for (int x = 0; x < clearedImg.getWidth(); x++)
		{
			const tcu::RGBA& clr = clearedImg.getPixel(x, y);
			if (clr != tcu::RGBA::black())
			{
				log << TestLog::Message << "Failure: first non-black pixel, color " << clr << ", detected at coordinates (" << x << ", " << y << ")" << TestLog::EndMessage;
				log << TestLog::Image("ClearedImg", "Image after clearing, erroneously non-black", clearedImg);
				m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Failed");
				return STOP;
			}
		}
	}

	log << TestLog::Message << "Drawing a viewport-sized quad with glStencilFunc(GL_EQUAL, 1, 1) and glStencilOp(GL_KEEP, GL_KEEP, GL_KEEP) - should result in same image as the first" << TestLog::EndMessage;

	renderQuad(Vec2(-1.0f, -1.0f),
			   Vec2( 1.0f, -1.0f),
			   Vec2(-1.0f,  1.0f),
			   Vec2( 1.0f,  1.0f),
			   Vec4(1.0f));

	readImage(renderedImgSecond);
	log << TestLog::Image("RenderedImgSecond", "Second image rendered", renderedImgSecond, QP_IMAGE_COMPRESSION_MODE_PNG);

	bool passed = tcu::pixelThresholdCompare(log,
											 "ImageCompare",
											 "Image comparison",
											 renderedImgFirst,
											 renderedImgSecond,
											 tcu::RGBA(0),
											 tcu::COMPARE_LOG_ON_ERROR);

	if (passed)
		log << TestLog::Message << "Success: The two images rendered are identical" << TestLog::EndMessage;

	m_context.getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
											 passed ? "Passed"				: "Failed");

	return STOP;
}